

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headergen.c
# Opt level: O3

int main(int argc,char **argv)

{
  char cVar1;
  char *pcVar2;
  fout f;
  fout *pfVar3;
  char cVar4;
  int iVar5;
  rnndb *db;
  size_t sVar6;
  char *pcVar7;
  FILE *pFVar8;
  char *pcVar9;
  ushort **ppuVar10;
  __int32_t **pp_Var11;
  rnnenum **pprVar12;
  rnnbitset **pprVar13;
  rnndomain **pprVar14;
  rnnenum *prVar15;
  rnnbitset *prVar16;
  rnndomain *prVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  
  if (argc < 2) {
LAB_00102143:
    main_cold_2();
    xmlCheckVersion(0x51b1);
    iVar5 = xmlInitParser();
    return iVar5;
  }
  rnn_init();
  db = rnn_newdb();
  rnn_parsefile(db,argv[1]);
  rnn_prepdb(db);
  if (0 < db->filesnum) {
    lVar19 = 0;
    do {
      pcVar2 = db->files[lVar19];
      sVar6 = strlen(pcVar2);
      pcVar7 = (char *)malloc(sVar6 + 3);
      strcpy(pcVar7,pcVar2);
      sVar6 = strlen(pcVar7);
      (pcVar7 + sVar6)[0] = '.';
      (pcVar7 + sVar6)[1] = 'h';
      pcVar7[sVar6 + 2] = '\0';
      pcVar2 = db->files[lVar19];
      pFVar8 = fopen(pcVar7,"w");
      if (pFVar8 == (FILE *)0x0) {
        main_cold_1();
        goto LAB_00102143;
      }
      free(pcVar7);
      pcVar9 = strrchr(pcVar2,0x2f);
      pcVar7 = pcVar9 + 1;
      if (pcVar9 == (char *)0x0) {
        pcVar7 = pcVar2;
      }
      pcVar7 = strdup(pcVar7);
      if (*pcVar7 != '\0') {
        ppuVar10 = __ctype_b_loc();
        uVar18 = 0;
        do {
          cVar1 = pcVar7[uVar18];
          cVar4 = '_';
          if (((*ppuVar10)[cVar1] & 8) != 0) {
            pp_Var11 = __ctype_toupper_loc();
            cVar4 = (char)(*pp_Var11)[cVar1];
          }
          pcVar7[uVar18] = cVar4;
          uVar18 = uVar18 + 1;
          sVar6 = strlen(pcVar7);
        } while (uVar18 < sVar6);
      }
      iVar5 = foutsnum;
      if (foutsmax <= foutsnum) {
        iVar5 = foutsmax * 2;
        if (foutsmax == 0) {
          iVar5 = 0x10;
        }
        foutsmax = iVar5;
        fouts = (fout *)realloc(fouts,(long)iVar5 * 0x18);
        iVar5 = foutsnum;
      }
      pfVar3 = fouts;
      foutsnum = iVar5 + 1;
      fouts[iVar5].guard = pcVar7;
      pfVar3[iVar5].name = pcVar2;
      pfVar3[iVar5].file = (FILE *)pFVar8;
      f.file = (FILE *)pFVar8;
      f.name = pcVar2;
      f.guard = pcVar7;
      printhead(f,db);
      lVar19 = lVar19 + 1;
    } while (lVar19 < db->filesnum);
  }
  iVar5 = db->enumsnum;
  if (0 < iVar5) {
    pprVar12 = db->enums;
    lVar19 = 0;
    do {
      if ((pprVar12[lVar19]->isinline == 0) && (prVar15 = pprVar12[lVar19], 0 < prVar15->valsnum)) {
        lVar20 = 0;
        do {
          printvalue(prVar15->vals[lVar20],0);
          lVar20 = lVar20 + 1;
          pprVar12 = db->enums;
          prVar15 = pprVar12[lVar19];
        } while (lVar20 < prVar15->valsnum);
        iVar5 = db->enumsnum;
      }
      lVar19 = lVar19 + 1;
    } while (lVar19 < iVar5);
  }
  iVar5 = db->bitsetsnum;
  if (0 < iVar5) {
    pprVar13 = db->bitsets;
    lVar19 = 0;
    do {
      if ((pprVar13[lVar19]->isinline == 0) &&
         (prVar16 = pprVar13[lVar19], 0 < prVar16->bitfieldsnum)) {
        lVar20 = 0;
        do {
          printbitfield(prVar16->bitfields[lVar20],0);
          lVar20 = lVar20 + 1;
          pprVar13 = db->bitsets;
          prVar16 = pprVar13[lVar19];
        } while (lVar20 < prVar16->bitfieldsnum);
        iVar5 = db->bitsetsnum;
      }
      lVar19 = lVar19 + 1;
    } while (lVar19 < iVar5);
  }
  if (0 < db->domainsnum) {
    pprVar14 = db->domains;
    lVar19 = 0;
    do {
      prVar17 = pprVar14[lVar19];
      if (prVar17->size != 0) {
        printdef(prVar17->fullname,"SIZE",0,prVar17->size,prVar17->file);
        pprVar14 = db->domains;
        prVar17 = pprVar14[lVar19];
      }
      if (0 < prVar17->subelemsnum) {
        lVar20 = 0;
        do {
          printdelem(prVar17->subelems[lVar20],0);
          lVar20 = lVar20 + 1;
          pprVar14 = db->domains;
          prVar17 = pprVar14[lVar19];
        } while (lVar20 < prVar17->subelemsnum);
      }
      lVar19 = lVar19 + 1;
    } while (lVar19 < db->domainsnum);
  }
  if (0 < foutsnum) {
    lVar20 = 0x10;
    lVar19 = 0;
    do {
      fprintf(*(FILE **)((long)fouts + lVar20 + -8),"\n#endif /* %s */\n",
              *(undefined8 *)((long)&fouts->name + lVar20));
      lVar19 = lVar19 + 1;
      lVar20 = lVar20 + 0x18;
    } while (lVar19 < foutsnum);
  }
  iVar5 = db->estatus;
  rnn_freedb(db);
  rnn_fini();
  return iVar5;
}

Assistant:

int main(int argc, char **argv) {
	struct rnndb *db;
	int i, j, ret;

	if (argc < 2) {
		fprintf(stderr, "Usage:\n\theadergen database-file\n");
		exit(1);
	}

	rnn_init();
	db = rnn_newdb();
	rnn_parsefile (db, argv[1]);
	rnn_prepdb (db);
	for(i = 0; i < db->filesnum; ++i) {
		char *dstname = malloc(strlen(db->files[i]) + 3);
		char *pretty;
		strcpy(dstname, db->files[i]);
		strcat(dstname, ".h");
		struct fout f = { db->files[i], fopen(dstname, "w") };
		if (!f.file) {
			perror(dstname);
			exit(1);
		}
		free(dstname);
		pretty = strrchr(f.name, '/');
		if (pretty)
			pretty += 1;
		else
			pretty = f.name;
		f.guard = strdup(pretty);
		for (j = 0; j < strlen(f.guard); j++)
			if (isalnum(f.guard[j]))
				f.guard[j] = toupper(f.guard[j]);
			else
				f.guard[j] = '_';
		ADDARRAY(fouts, f);
		printhead(f, db);
	}

	for (i = 0; i < db->enumsnum; i++) {
		if (db->enums[i]->isinline)
			continue;
		int j;
		for (j = 0; j < db->enums[i]->valsnum; j++)
			printvalue (db->enums[i]->vals[j], 0);
	}
	for (i = 0; i < db->bitsetsnum; i++) {
		if (db->bitsets[i]->isinline)
			continue;
		int j;
		for (j = 0; j < db->bitsets[i]->bitfieldsnum; j++)
			printbitfield (db->bitsets[i]->bitfields[j], 0);
	}
	for (i = 0; i < db->domainsnum; i++) {
		if (db->domains[i]->size)
			printdef (db->domains[i]->fullname, "SIZE", 0, db->domains[i]->size, db->domains[i]->file);
		int j;
		for (j = 0; j < db->domains[i]->subelemsnum; j++) {
			printdelem(db->domains[i]->subelems[j], 0);
		}
	}
	for(i = 0; i < foutsnum; ++i) {
		fprintf (fouts[i].file, "\n#endif /* %s */\n", fouts[i].guard);
	}
	ret = db->estatus;

	rnn_freedb(db);
	rnn_fini();

	return ret;
}